

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O1

bool __thiscall GMESong::StartTrack(GMESong *this,int track,bool getcritsec)

{
  gme_info_t *pgVar1;
  gme_err_t pcVar2;
  int start_msec;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,getcritsec) != 0) {
    FCriticalSection::Enter(&this->CritSec);
  }
  pcVar2 = gme_start_track(this->Emu,track);
  if (getcritsec) {
    FCriticalSection::Leave(&this->CritSec);
  }
  if (pcVar2 == (gme_err_t)0x0) {
    this->CurrTrack = track;
    GetTrackInfo(this);
    if ((this->super_StreamSong).super_MusInfo.m_Looping == false) {
      pgVar1 = this->TrackInfo;
      start_msec = 150000;
      if ((pgVar1 != (gme_info_t *)0x0) && (start_msec = pgVar1->length, start_msec < 1)) {
        start_msec = 150000;
        if (0 < pgVar1->loop_length) {
          start_msec = pgVar1->loop_length * 2 + pgVar1->intro_length;
        }
      }
      gme_set_fade(this->Emu,start_msec);
    }
  }
  else {
    Printf("Could not start track %d: %s\n",track,pcVar2);
  }
  return pcVar2 == (gme_err_t)0x0;
}

Assistant:

bool GMESong::StartTrack(int track, bool getcritsec)
{
	gme_err_t err;

	if (getcritsec)
	{
		CritSec.Enter();
	}
	err = gme_start_track(Emu, track);
	if (getcritsec)
	{
		CritSec.Leave();
	}
	if (err != NULL)
	{
		Printf("Could not start track %d: %s\n", track, err);
		return false;
	}
	CurrTrack = track;
	GetTrackInfo();
	if (!m_Looping)
	{
		gme_set_fade(Emu, CalcSongLength());
	}
	return true;
}